

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  CommentInfo *pCVar2;
  string local_40;
  
  pCVar2 = root->comments_;
  if (pCVar2 != (CommentInfo *)0x0) {
    if (pCVar2[1].comment_ != (char *)0x0) {
      local_40._M_dataplus._M_p._0_1_ = 0x20;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->document_,(char *)&local_40,1);
      Value::getComment_abi_cxx11_(&local_40,root,commentAfterOnSameLine);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                         local_40._M_dataplus._M_p._0_1_),local_40._M_string_length)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
          &local_40.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
      }
      pCVar2 = root->comments_;
      if (pCVar2 == (CommentInfo *)0x0) goto LAB_001183de;
    }
    if (pCVar2[2].comment_ != (char *)0x0) {
      writeIndent(this);
      poVar1 = this->document_;
      Value::getComment_abi_cxx11_(&local_40,root,commentAfter);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                         local_40._M_dataplus._M_p._0_1_),local_40._M_string_length)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
          &local_40.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
      }
    }
  }
LAB_001183de:
  this->field_0x68 = this->field_0x68 & 0xfd;
  return;
}

Assistant:

void StyledStreamWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    *document_ << ' ' << root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *document_ << root.getComment(commentAfter);
  }
  indented_ = false;
}